

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenMatrixBaseSerialize.hpp
# Opt level: O0

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::
serialize<boost::archive::text_oarchive>
          (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this,text_oarchive *ar,
          uint version)

{
  Index IVar1;
  Index IVar2;
  nvp<double> *in_RSI;
  Index in_RDI;
  int i;
  int j;
  int c;
  int r;
  nvp<int> *in_stack_ffffffffffffff88;
  nvp<double> *t;
  nvp<double> *this_00;
  undefined1 in_stack_ffffffffffffffa8 [16];
  undefined4 local_48;
  undefined4 local_44;
  
  IVar1 = rows((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x330f71);
  IVar2 = cols((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x330f7f);
  this_00 = in_RSI;
  boost::serialization::make_nvp<int>((char *)in_RSI,(int *)in_stack_ffffffffffffff88);
  boost::archive::detail::interface_oarchive<boost::archive::text_oarchive>::operator&
            ((interface_oarchive<boost::archive::text_oarchive> *)this_00,in_stack_ffffffffffffff88)
  ;
  boost::serialization::make_nvp<int>((char *)this_00,(int *)in_stack_ffffffffffffff88);
  boost::archive::detail::interface_oarchive<boost::archive::text_oarchive>::operator&
            ((interface_oarchive<boost::archive::text_oarchive> *)this_00,in_stack_ffffffffffffff88)
  ;
  resize(in_stack_ffffffffffffffa8._8_8_,in_stack_ffffffffffffffa8._0_8_,in_RDI);
  for (local_44 = 0; local_44 < (int)IVar2; local_44 = local_44 + 1) {
    for (local_48 = 0; local_48 < (int)IVar1; local_48 = local_48 + 1) {
      t = in_RSI;
      DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,(Index)in_RSI
                 ,0x331040);
      boost::serialization::make_nvp<double>((char *)this_00,(double *)t);
      boost::archive::detail::interface_oarchive<boost::archive::text_oarchive>::operator&
                ((interface_oarchive<boost::archive::text_oarchive> *)this_00,t);
    }
  }
  return;
}

Assistant:

inline void serialize(Archive & ar, const unsigned int version)
{
    int r = this->rows();     // makes sense for saving only
    int c = this->cols();

    ar & boost::serialization::make_nvp("rows",r);
    ar & boost::serialization::make_nvp("cols",c);

    this->resize(r,c);        // makes sense for loading only

    for(int j = 0; j < c; j++)
	    for(int i = 0; i < r; i++)
            ar & boost::serialization::make_nvp("data",this->operator()(i,j));
}